

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  string *this_00;
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_type sVar5;
  uint uVar6;
  IResultCapture *pIVar7;
  long *local_40 [2];
  long local_30 [2];
  
  uVar2 = *(undefined4 *)((long)&(builder->m_info).macroName.m_start + 4);
  sVar5 = (builder->m_info).macroName.m_size;
  uVar3 = *(undefined4 *)((long)&(builder->m_info).macroName.m_size + 4);
  *(undefined4 *)&(this->m_info).macroName.m_start =
       *(undefined4 *)&(builder->m_info).macroName.m_start;
  *(undefined4 *)((long)&(this->m_info).macroName.m_start + 4) = uVar2;
  *(int *)&(this->m_info).macroName.m_size = (int)sVar5;
  *(undefined4 *)((long)&(this->m_info).macroName.m_size + 4) = uVar3;
  this_00 = &(this->m_info).message;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (builder->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + (builder->m_info).message._M_string_length);
  uVar6 = (builder->m_info).sequence;
  (this->m_info).type = (builder->m_info).type;
  (this->m_info).sequence = uVar6;
  sVar4 = (builder->m_info).lineInfo.line;
  (this->m_info).lineInfo.file = (builder->m_info).lineInfo.file;
  (this->m_info).lineInfo.line = sVar4;
  this->m_moved = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pIVar7 = getResultCapture();
  (*pIVar7->_vptr_IResultCapture[6])(pIVar7,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info ), m_moved()
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }